

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

string * __thiscall
compiler::AssemblerCompiler::do_declaration_abi_cxx11_
          (string *__return_storage_ptr__,AssemblerCompiler *this,Declaration *declaration)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined8 *puVar1;
  socklen_t *in_RCX;
  undefined8 *puVar2;
  undefined1 local_90 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = *(undefined8 **)&declaration->field_0x10;
  __return_storage_ptr___00 =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_90 + 0x20);
  for (puVar2 = *(undefined8 **)&declaration->variables; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    Var::accept_abi_cxx11_((Var *)local_90,(int)*puVar2,(sockaddr *)this,in_RCX);
    std::operator+(__return_storage_ptr___00,"DECL ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90);
    std::operator+(&local_50,__return_storage_ptr___00,";");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)__return_storage_ptr___00);
    std::__cxx11::string::~string((string *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string AssemblerCompiler::do_declaration(const Declaration *declaration) {
    std::string temp;
    for (auto i : declaration->variables) {
        temp += "DECL " + i->accept(this) + ";";
    }
    return temp;
}